

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.cpp
# Opt level: O1

Result<vkb::Swapchain> * __thiscall
vkb::SwapchainBuilder::build(Result<vkb::Swapchain> *__return_storage_ptr__,SwapchainBuilder *this)

{
  VkPresentModeKHR VVar1;
  uint uVar2;
  uint uVar3;
  uint32_t uVar4;
  VkPresentModeKHR *desired_pm;
  pointer pVVar5;
  VkPhysicalDevice pVVar6;
  pointer ppVVar7;
  code *pcVar8;
  VkSurfaceFormatKHR *pVVar9;
  long lVar10;
  VkPresentModeKHR VVar11;
  VkColorSpaceKHR VVar12;
  Swapchain *pSVar13;
  SwapchainBuilder *this_00;
  Result<vkb::Swapchain> *pRVar14;
  ulong in_R8;
  VkSurfaceTransformFlagBitsKHR VVar15;
  pointer pVVar16;
  uint uVar17;
  ulong uVar18;
  VkColorSpaceKHR VVar19;
  uint uVar20;
  bool bVar21;
  byte bVar22;
  vector<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_> desired_present_modes;
  vector<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_> desired_formats;
  uint32_t queue_family_indices [2];
  SurfaceSupportDetails surface_support;
  VkSwapchainCreateInfoKHR swapchain_create_info;
  Result<std::vector<VkImage_T_*,_std::allocator<VkImage_T_*>_>_> images;
  Result<vkb::detail::SurfaceSupportDetails> surface_support_ret;
  undefined4 in_stack_fffffffffffffda8;
  undefined4 in_stack_fffffffffffffdac;
  undefined1 local_248 [48];
  VkSurfaceKHR local_218;
  uint32_t local_210;
  uint32_t local_20c;
  VkSurfaceFormatKHR local_208;
  VkExtent2D VStack_200;
  uint32_t local_1f8;
  uint uStack_1f4;
  VkExtent2D VStack_1f0;
  uint local_1e8;
  uint32_t uStack_1e4;
  VkSurfaceTransformFlagBitsKHR VStack_1e0;
  uint32_t uStack_1dc;
  uint local_1d8;
  vector<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_> local_1d0;
  vector<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_> local_1b8;
  VkSwapchainCreateInfoKHR local_198;
  Swapchain local_128;
  anon_union_24_2_293c120a_for_Result<std::vector<VkImage_T_*,_std::allocator<VkImage_T_*>_>_>_1
  local_c0;
  char local_a8;
  undefined1 local_a0 [80];
  vector<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_> local_50;
  bool local_38;
  
  bVar22 = 0;
  if ((this->info).surface == (VkSurfaceKHR)0x0) {
    (__return_storage_ptr__->field_0).m_error.type._M_value = 0;
    (__return_storage_ptr__->field_0).m_value.swapchain =
         (VkSwapchainKHR)&detail::swapchain_error_category;
    (__return_storage_ptr__->field_0).m_value.image_count = 0;
    __return_storage_ptr__->m_init = false;
    return __return_storage_ptr__;
  }
  std::vector<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>::vector
            ((vector<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_> *)(local_248 + 0x20),
             &(this->info).desired_formats);
  if (local_248._40_8_ == local_248._32_8_) {
    local_a0._0_4_ = VK_FORMAT_B8G8R8A8_SRGB;
    local_a0._4_4_ = VK_COLORSPACE_SRGB_NONLINEAR_KHR;
    std::vector<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>::
    emplace_back<VkSurfaceFormatKHR>
              ((vector<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_> *)(local_248 + 0x20)
               ,(VkSurfaceFormatKHR *)local_a0);
    local_a0._0_4_ = VK_FORMAT_R8G8B8A8_SRGB;
    local_a0._4_4_ = VK_COLORSPACE_SRGB_NONLINEAR_KHR;
    std::vector<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>::
    emplace_back<VkSurfaceFormatKHR>
              ((vector<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_> *)(local_248 + 0x20)
               ,(VkSurfaceFormatKHR *)local_a0);
  }
  this_00 = (SwapchainBuilder *)local_248;
  std::vector<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>::vector
            ((vector<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_> *)this_00,
             &(this->info).desired_present_modes);
  if (local_248._8_8_ == local_248._0_8_) {
    add_desired_present_modes
              (this_00,(vector<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_> *)local_248);
  }
  detail::query_surface_support_details
            ((VkPhysicalDevice)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8),
             (VkSurfaceKHR)0x10a343);
  if (local_38 == false) {
    (__return_storage_ptr__->field_0).m_error.type._M_value = 1;
    (__return_storage_ptr__->field_0).m_value.swapchain =
         (VkSwapchainKHR)&detail::swapchain_error_category;
    (__return_storage_ptr__->field_0).m_value.image_count = local_a0._16_4_;
    __return_storage_ptr__->m_init = false;
    goto LAB_0010a8fa;
  }
  local_1d8 = local_a0._48_4_;
  local_1f8 = local_a0._16_4_;
  uStack_1f4 = local_a0._20_4_;
  local_1e8 = local_a0._32_4_;
  uStack_1e4 = local_a0._36_4_;
  VStack_1e0 = local_a0._40_4_;
  uStack_1dc = local_a0._44_4_;
  VStack_1f0.width = local_a0._24_4_;
  VStack_1f0.height = local_a0._28_4_;
  local_208.format = local_a0._0_4_;
  local_208.colorSpace = local_a0._4_4_;
  VStack_200.width = local_a0._8_4_;
  VStack_200.height = local_a0._12_4_;
  std::vector<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>::vector
            (&local_1d0,
             (vector<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_> *)(local_a0 + 0x38));
  std::vector<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>::vector(&local_1b8,&local_50);
  VVar12 = (this->info).required_min_image_count;
  if (VVar12 == VK_COLORSPACE_SRGB_NONLINEAR_KHR) {
    VVar19 = (this->info).min_image_count;
    if (VVar19 == VK_COLORSPACE_SRGB_NONLINEAR_KHR) {
      VVar12 = local_208.format + 1;
    }
    else {
      VVar12 = local_208.format;
      if (local_208.format < VVar19) {
        VVar12 = VVar19;
      }
    }
LAB_0010a402:
    VVar19 = local_208.colorSpace;
    if (VVar12 < local_208.colorSpace) {
      VVar19 = VVar12;
    }
    if (local_208.colorSpace == VK_COLORSPACE_SRGB_NONLINEAR_KHR) {
      VVar19 = VVar12;
    }
    if (local_248._32_8_ != local_248._40_8_) {
      in_R8 = 0;
      pVVar9 = (VkSurfaceFormatKHR *)local_248._32_8_;
      do {
        if (local_1d0.super__Vector_base<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>.
            _M_impl.super__Vector_impl_data._M_start !=
            local_1d0.super__Vector_base<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
          bVar21 = false;
          pVVar5 = local_1d0.
                   super__Vector_base<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          do {
            if ((pVVar9->format == pVVar5->format) && (pVVar9->colorSpace == pVVar5->colorSpace)) {
              local_198._0_8_ = *pVVar9;
              if (!bVar21) {
                local_198.sType = local_198.sType;
                local_198._4_4_ = local_198._4_4_;
                bVar21 = true;
                if (in_R8 != 0) goto LAB_0010a48c;
                goto LAB_0010a499;
              }
              break;
            }
            pVVar5 = pVVar5 + 1;
            bVar21 = pVVar5 == local_1d0.
                               super__Vector_base<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>
                               ._M_impl.super__Vector_impl_data._M_finish;
          } while (!bVar21);
        }
        pVVar9 = pVVar9 + 1;
        in_R8 = (ulong)(pVVar9 == (VkSurfaceFormatKHR *)local_248._40_8_);
      } while (pVVar9 != (VkSurfaceFormatKHR *)local_248._40_8_);
    }
LAB_0010a48c:
    local_198.sType = VK_FORMAT_R5G6B5_UNORM_PACK16;
    bVar21 = false;
LAB_0010a499:
    pVVar5 = local_1d0.super__Vector_base<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if (bVar21) {
      pVVar5 = (pointer)&local_198;
    }
    if (VStack_200.width == 0xffffffff) {
      uVar20 = (this->info).desired_width;
      uVar17 = (this->info).desired_height;
      if (VStack_1f0.width < uVar20) {
        uVar20 = VStack_1f0.width;
      }
      if (uVar20 < local_1f8) {
        uVar20 = local_1f8;
      }
      if (VStack_1f0.height < uVar17) {
        uVar17 = VStack_1f0.height;
      }
      uVar18 = (ulong)uVar17;
      if (uVar17 < uStack_1f4) {
        uVar18 = (ulong)uStack_1f4;
      }
    }
    else {
      uVar18 = (ulong)VStack_200 >> 0x20;
      uVar20 = VStack_200.width;
    }
    local_248._24_8_ = *pVVar5;
    uVar17 = (this->info).array_layer_count;
    uVar2 = local_1e8;
    if (uVar17 <= local_1e8) {
      uVar2 = uVar17;
    }
    uVar3 = 1;
    if (uVar17 != 0) {
      uVar3 = uVar2;
    }
    local_210 = (this->info).graphics_queue_index;
    local_20c = (this->info).present_queue_index;
    VVar11 = VK_PRESENT_MODE_FIFO_KHR;
    if (local_248._0_8_ != local_248._8_8_) {
      pVVar6 = (VkPhysicalDevice)local_248._0_8_;
      do {
        bVar21 = local_1b8.super__Vector_base<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>.
                 _M_impl.super__Vector_impl_data._M_start ==
                 local_1b8.super__Vector_base<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        if (local_1b8.super__Vector_base<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>.
            _M_impl.super__Vector_impl_data._M_start !=
            local_1b8.super__Vector_base<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
          VVar1 = *(VkPresentModeKHR *)pVVar6;
          in_R8 = in_R8 & 0xffffffff;
          pVVar16 = local_1b8.
                    super__Vector_base<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>._M_impl.
                    super__Vector_impl_data._M_start;
          if (VVar1 == *local_1b8.
                        super__Vector_base<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>.
                        _M_impl.super__Vector_impl_data._M_start) {
            in_R8 = (ulong)VVar1;
            bVar21 = false;
          }
          else {
            do {
              pVVar16 = pVVar16 + 1;
              bVar21 = pVVar16 ==
                       local_1b8.
                       super__Vector_base<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>.
                       _M_impl.super__Vector_impl_data._M_finish;
              if (bVar21) goto LAB_0010a592;
            } while (VVar1 != *pVVar16);
            in_R8 = (ulong)VVar1;
          }
        }
LAB_0010a592:
        if (!bVar21) {
          VVar11 = (VkPresentModeKHR)in_R8;
          break;
        }
        pVVar6 = pVVar6 + 4;
      } while (pVVar6 != (VkPhysicalDevice)local_248._8_8_);
    }
    if ((VVar11 < 4) && (((this->info).image_usage_flags & ~local_1d8) != 0)) {
      (__return_storage_ptr__->field_0).m_error.type._M_value = 6;
      goto LAB_0010a8aa;
    }
    VVar15 = (this->info).pre_transform;
    if (VVar15 == 0) {
      VVar15 = VStack_1e0;
    }
    local_198.pNext = (void *)0x0;
    local_198.preTransform = 0;
    local_198.compositeAlpha = 0;
    local_198.presentMode = VK_PRESENT_MODE_IMMEDIATE_KHR;
    local_198.clipped = 0;
    local_198.queueFamilyIndexCount = 0;
    local_198._68_4_ = 0;
    local_198.pQueueFamilyIndices = (uint32_t *)0x0;
    local_198.imageExtent.height = 0;
    local_198.imageArrayLayers = 0;
    local_198.imageUsage = 0;
    local_198.imageSharingMode = VK_SHARING_MODE_EXCLUSIVE;
    local_198.minImageCount = 0;
    local_198.imageFormat = VK_FORMAT_UNDEFINED;
    local_198.imageColorSpace = VK_COLORSPACE_SRGB_NONLINEAR_KHR;
    local_198.imageExtent.width = 0;
    local_198.flags = 0;
    local_198._20_4_ = 0;
    local_198.surface = (VkSurfaceKHR)0x0;
    local_198.oldSwapchain = (VkSwapchainKHR)0x0;
    local_198.sType = 0x3b9acde8;
    local_198._4_4_ = VK_COLORSPACE_SRGB_NONLINEAR_KHR;
    detail::setup_pNext_chain<VkSwapchainCreateInfoKHR>(&local_198,&(this->info).pNext_chain);
    for (ppVVar7 = (this->info).pNext_chain.
                   super__Vector_base<VkBaseOutStructure_*,_std::allocator<VkBaseOutStructure_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        ppVVar7 !=
        (this->info).pNext_chain.
        super__Vector_base<VkBaseOutStructure_*,_std::allocator<VkBaseOutStructure_*>_>._M_impl.
        super__Vector_impl_data._M_finish; ppVVar7 = ppVVar7 + 1) {
      if ((*ppVVar7)->sType == VK_STRUCTURE_TYPE_APPLICATION_INFO) {
        __assert_fail("node->sType != VK_STRUCTURE_TYPE_APPLICATION_INFO",
                      "/workspace/llm4binary/github/license_c_cmakelists/charles-lunarg[P]vk-bootstrap/src/VkBootstrap.cpp"
                      ,0x7b1,"Result<Swapchain> vkb::SwapchainBuilder::build() const");
      }
    }
    local_198.flags = (this->info).create_flags;
    local_198.surface = (this->info).surface;
    local_198.imageFormat = (VkFormat)local_248._24_8_;
    local_198.minImageCount = VVar19;
    VVar12 = SUB84(local_248._24_8_,4);
    local_198.imageExtent.height = (uint32_t)uVar18;
    local_198.imageUsage = (this->info).image_usage_flags;
    bVar21 = (this->info).graphics_queue_index != (this->info).present_queue_index;
    if (bVar21) {
      local_198.queueFamilyIndexCount = 2;
      local_198.pQueueFamilyIndices = &local_210;
    }
    local_198.imageSharingMode = (VkSharingMode)bVar21;
    local_198.compositeAlpha = (this->info).composite_alpha;
    local_198.preTransform = VVar15;
    local_198.clipped._0_1_ = (this->info).clipped;
    local_198.presentMode = VVar11;
    local_198.clipped._1_3_ = 0;
    local_198.oldSwapchain = (this->info).old_swapchain;
    local_128.extent.width = 0;
    local_128.extent.height = 0;
    local_128.requested_min_image_count = 0;
    local_128.present_mode = VK_PRESENT_MODE_IMMEDIATE_KHR;
    local_128.image_count = 0;
    local_128.image_format = VK_FORMAT_UNDEFINED;
    local_128.color_space = VK_COLORSPACE_SRGB_NONLINEAR_KHR;
    local_128.image_usage_flags = 0;
    local_128.device = (VkDevice)0x0;
    local_128.swapchain = (VkSwapchainKHR)0x0;
    local_128.instance_version = 0x400000;
    local_128._52_4_ = 0;
    local_128.allocation_callbacks = (VkAllocationCallbacks *)0x0;
    local_128.internal_table.fp_vkGetSwapchainImagesKHR = (PFN_vkGetSwapchainImagesKHR)0x0;
    local_128.internal_table.fp_vkCreateImageView = (PFN_vkCreateImageView)0x0;
    local_128.internal_table.fp_vkDestroyImageView = (PFN_vkDestroyImageView)0x0;
    local_128.internal_table.fp_vkDestroySwapchainKHR = (PFN_vkDestroySwapchainKHR)0x0;
    local_198.imageColorSpace = VVar12;
    local_198.imageExtent.width = uVar20;
    local_198.imageArrayLayers = uVar3;
    pcVar8 = (code *)(*(code *)detail::vulkan_functions()::v._192_8_)
                               ((this->info).device,"vkCreateSwapchainKHR");
    uVar4 = (*pcVar8)((this->info).device,&local_198,(this->info).allocation_callbacks,
                      &local_128.swapchain);
    if (uVar4 != 0) {
      (__return_storage_ptr__->field_0).m_error.type._M_value = 2;
      (__return_storage_ptr__->field_0).m_value.swapchain =
           (VkSwapchainKHR)&detail::swapchain_error_category;
      (__return_storage_ptr__->field_0).m_value.image_count = uVar4;
      goto LAB_0010a8bc;
    }
    local_128.device = (this->info).device;
    local_128.image_format = (VkFormat)local_248._24_8_;
    local_128.image_usage_flags = (this->info).image_usage_flags;
    local_128.color_space = VVar12;
    local_128.extent = (VkExtent2D)((ulong)uVar20 | uVar18 << 0x20);
    local_128.internal_table.fp_vkGetSwapchainImagesKHR =
         (PFN_vkGetSwapchainImagesKHR)
         (*(code *)detail::vulkan_functions()::v._192_8_)
                   (local_128.device,"vkGetSwapchainImagesKHR");
    local_128.internal_table.fp_vkCreateImageView =
         (PFN_vkCreateImageView)
         (*(code *)detail::vulkan_functions()::v._192_8_)((this->info).device,"vkCreateImageView");
    local_128.internal_table.fp_vkDestroyImageView =
         (PFN_vkDestroyImageView)
         (*(code *)detail::vulkan_functions()::v._192_8_)((this->info).device,"vkDestroyImageView");
    local_128.internal_table.fp_vkDestroySwapchainKHR =
         (PFN_vkDestroySwapchainKHR)
         (*(code *)detail::vulkan_functions()::v._192_8_)
                   ((this->info).device,"vkDestroySwapchainKHR");
    Swapchain::get_images
              ((Result<std::vector<VkImage_T_*,_std::allocator<VkImage_T_*>_>_> *)&local_c0.m_value,
               &local_128);
    if (local_a8 == '\0') {
      (__return_storage_ptr__->field_0).m_error.type._M_value = 3;
      (__return_storage_ptr__->field_0).m_value.swapchain =
           (VkSwapchainKHR)&detail::swapchain_error_category;
      (__return_storage_ptr__->field_0).m_value.image_count = 0;
      bVar21 = false;
    }
    else {
      local_128.present_mode = VVar11;
      local_128.requested_min_image_count = VVar19;
      local_128.image_count =
           (uint32_t)
           ((ulong)((long)local_c0.m_value.
                          super__Vector_base<VkImage_T_*,_std::allocator<VkImage_T_*>_>._M_impl.
                          super__Vector_impl_data._M_finish - local_c0._0_8_) >> 3);
      local_128.instance_version = (this->info).instance_version;
      local_128.allocation_callbacks = (this->info).allocation_callbacks;
      pSVar13 = &local_128;
      pRVar14 = __return_storage_ptr__;
      for (lVar10 = 0xc; lVar10 != 0; lVar10 = lVar10 + -1) {
        (pRVar14->field_0).m_value.device = pSVar13->device;
        pSVar13 = (Swapchain *)((long)pSVar13 + ((ulong)bVar22 * -2 + 1) * 8);
        pRVar14 = (Result<vkb::Swapchain> *)((long)pRVar14 + (ulong)bVar22 * -0x10 + 8);
      }
      bVar21 = true;
    }
    __return_storage_ptr__->m_init = bVar21;
    if ((local_a8 != '\0') &&
       (local_c0.m_value.super__Vector_base<VkImage_T_*,_std::allocator<VkImage_T_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0)) {
      operator_delete(local_c0.m_value.super__Vector_base<VkImage_T_*,_std::allocator<VkImage_T_*>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_c0.m_value.
                            super__Vector_base<VkImage_T_*,_std::allocator<VkImage_T_*>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage - local_c0._0_8_);
    }
  }
  else {
    if (local_208.format <= VVar12) goto LAB_0010a402;
    (__return_storage_ptr__->field_0).m_error.type._M_value = 5;
LAB_0010a8aa:
    (__return_storage_ptr__->field_0).m_value.swapchain =
         (VkSwapchainKHR)&detail::swapchain_error_category;
    (__return_storage_ptr__->field_0).m_value.image_count = 0;
LAB_0010a8bc:
    __return_storage_ptr__->m_init = false;
  }
  if (local_1b8.super__Vector_base<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1b8.
                    super__Vector_base<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1b8.
                          super__Vector_base<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1b8.
                          super__Vector_base<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_1d0.super__Vector_base<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1d0.
                    super__Vector_base<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_1d0.
                          super__Vector_base<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1d0.
                          super__Vector_base<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
LAB_0010a8fa:
  Result<vkb::detail::SurfaceSupportDetails>::destroy
            ((Result<vkb::detail::SurfaceSupportDetails> *)local_a0);
  if ((VkPhysicalDevice)local_248._0_8_ != (VkPhysicalDevice)0x0) {
    operator_delete((void *)local_248._0_8_,local_248._16_8_ - local_248._0_8_);
  }
  if ((VkSurfaceFormatKHR *)local_248._32_8_ != (VkSurfaceFormatKHR *)0x0) {
    operator_delete((void *)local_248._32_8_,(long)local_218 - local_248._32_8_);
  }
  return __return_storage_ptr__;
}

Assistant:

Result<Swapchain> SwapchainBuilder::build() const {
    if (info.surface == VK_NULL_HANDLE) {
        return Error{ SwapchainError::surface_handle_not_provided };
    }

    auto desired_formats = info.desired_formats;
    if (desired_formats.size() == 0) add_desired_formats(desired_formats);
    auto desired_present_modes = info.desired_present_modes;
    if (desired_present_modes.size() == 0) add_desired_present_modes(desired_present_modes);

    auto surface_support_ret = detail::query_surface_support_details(info.physical_device, info.surface);
    if (!surface_support_ret.has_value())
        return Error{ SwapchainError::failed_query_surface_support_details, surface_support_ret.vk_result() };
    auto surface_support = surface_support_ret.value();

    uint32_t image_count = info.min_image_count;
    if (info.required_min_image_count >= 1) {
        if (info.required_min_image_count < surface_support.capabilities.minImageCount)
            return make_error_code(SwapchainError::required_min_image_count_too_low);

        image_count = info.required_min_image_count;
    } else if (info.min_image_count == 0) {
        // We intentionally use minImageCount + 1 to maintain existing behavior, even if it typically results in triple buffering on most systems.
        image_count = surface_support.capabilities.minImageCount + 1;
    } else {
        image_count = info.min_image_count;
        if (image_count < surface_support.capabilities.minImageCount)
            image_count = surface_support.capabilities.minImageCount;
    }
    if (surface_support.capabilities.maxImageCount > 0 && image_count > surface_support.capabilities.maxImageCount) {
        image_count = surface_support.capabilities.maxImageCount;
    }

    VkSurfaceFormatKHR surface_format = detail::find_best_surface_format(surface_support.formats, desired_formats);

    VkExtent2D extent = detail::find_extent(surface_support.capabilities, info.desired_width, info.desired_height);

    uint32_t image_array_layers = info.array_layer_count;
    if (surface_support.capabilities.maxImageArrayLayers < info.array_layer_count)
        image_array_layers = surface_support.capabilities.maxImageArrayLayers;
    if (info.array_layer_count == 0) image_array_layers = 1;

    uint32_t queue_family_indices[] = { info.graphics_queue_index, info.present_queue_index };


    VkPresentModeKHR present_mode = detail::find_present_mode(surface_support.present_modes, desired_present_modes);

    // VkSurfaceCapabilitiesKHR::supportedUsageFlags is only only valid for some present modes. For shared present modes, we should also check VkSharedPresentSurfaceCapabilitiesKHR::sharedPresentSupportedUsageFlags.
    auto is_unextended_present_mode = [](VkPresentModeKHR present_mode) {
        return (present_mode == VK_PRESENT_MODE_IMMEDIATE_KHR) || (present_mode == VK_PRESENT_MODE_MAILBOX_KHR) ||
               (present_mode == VK_PRESENT_MODE_FIFO_KHR) || (present_mode == VK_PRESENT_MODE_FIFO_RELAXED_KHR);
    };

    if (is_unextended_present_mode(present_mode) &&
        (info.image_usage_flags & surface_support.capabilities.supportedUsageFlags) != info.image_usage_flags) {
        return Error{ SwapchainError::required_usage_not_supported };
    }

    VkSurfaceTransformFlagBitsKHR pre_transform = info.pre_transform;
    if (info.pre_transform == static_cast<VkSurfaceTransformFlagBitsKHR>(0))
        pre_transform = surface_support.capabilities.currentTransform;

    VkSwapchainCreateInfoKHR swapchain_create_info = {};
    swapchain_create_info.sType = VK_STRUCTURE_TYPE_SWAPCHAIN_CREATE_INFO_KHR;
    detail::setup_pNext_chain(swapchain_create_info, info.pNext_chain);
#if !defined(NDEBUG)
    for (auto& node : info.pNext_chain) {
        assert(node->sType != VK_STRUCTURE_TYPE_APPLICATION_INFO);
    }
#endif
    swapchain_create_info.flags = info.create_flags;
    swapchain_create_info.surface = info.surface;
    swapchain_create_info.minImageCount = image_count;
    swapchain_create_info.imageFormat = surface_format.format;
    swapchain_create_info.imageColorSpace = surface_format.colorSpace;
    swapchain_create_info.imageExtent = extent;
    swapchain_create_info.imageArrayLayers = image_array_layers;
    swapchain_create_info.imageUsage = info.image_usage_flags;

    if (info.graphics_queue_index != info.present_queue_index) {
        swapchain_create_info.imageSharingMode = VK_SHARING_MODE_CONCURRENT;
        swapchain_create_info.queueFamilyIndexCount = 2;
        swapchain_create_info.pQueueFamilyIndices = queue_family_indices;
    } else {
        swapchain_create_info.imageSharingMode = VK_SHARING_MODE_EXCLUSIVE;
    }

    swapchain_create_info.preTransform = pre_transform;
    swapchain_create_info.compositeAlpha = info.composite_alpha;
    swapchain_create_info.presentMode = present_mode;
    swapchain_create_info.clipped = info.clipped;
    swapchain_create_info.oldSwapchain = info.old_swapchain;
    Swapchain swapchain{};
    PFN_vkCreateSwapchainKHR swapchain_create_proc;
    detail::vulkan_functions().get_device_proc_addr(info.device, swapchain_create_proc, "vkCreateSwapchainKHR");
    auto res = swapchain_create_proc(info.device, &swapchain_create_info, info.allocation_callbacks, &swapchain.swapchain);

    if (res != VK_SUCCESS) {
        return Error{ SwapchainError::failed_create_swapchain, res };
    }
    swapchain.device = info.device;
    swapchain.image_format = surface_format.format;
    swapchain.color_space = surface_format.colorSpace;
    swapchain.image_usage_flags = info.image_usage_flags;
    swapchain.extent = extent;
    detail::vulkan_functions().get_device_proc_addr(
        info.device, swapchain.internal_table.fp_vkGetSwapchainImagesKHR, "vkGetSwapchainImagesKHR");
    detail::vulkan_functions().get_device_proc_addr(info.device, swapchain.internal_table.fp_vkCreateImageView, "vkCreateImageView");
    detail::vulkan_functions().get_device_proc_addr(info.device, swapchain.internal_table.fp_vkDestroyImageView, "vkDestroyImageView");
    detail::vulkan_functions().get_device_proc_addr(
        info.device, swapchain.internal_table.fp_vkDestroySwapchainKHR, "vkDestroySwapchainKHR");
    auto images = swapchain.get_images();
    if (!images) {
        return Error{ SwapchainError::failed_get_swapchain_images };
    }
    swapchain.requested_min_image_count = image_count;
    swapchain.present_mode = present_mode;
    swapchain.image_count = static_cast<uint32_t>(images.value().size());
    swapchain.instance_version = info.instance_version;
    swapchain.allocation_callbacks = info.allocation_callbacks;
    return swapchain;
}